

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

void __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
customize<viennamath::rt_function_symbol<viennamath::rt_expression_interface<double>>>
          (rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_function_symbol<viennamath::rt_expression_interface<double>_> *e,string *output)

{
  bool bVar1;
  uint uVar2;
  reference pprVar3;
  ostream *poVar4;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_40;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_**,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_38;
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
  local_30;
  const_iterator it;
  bool found;
  string *output_local;
  rt_function_symbol<viennamath::rt_expression_interface<double>_> *e_local;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *this_local;
  
  it._M_current._7_1_ = 0;
  local_38._M_current =
       (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
       std::
       vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
       ::begin((vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                *)this);
  __gnu_cxx::
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*const*,std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*,std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*>>>
  ::
  __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>**>
            ((__normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*const*,std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*,std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>>*>>>
              *)&local_30,&local_38);
  while( true ) {
    local_40._M_current =
         (rt_latex_processor_interface<viennamath::rt_expression_interface<double>_> **)
         std::
         vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
         ::end((vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>
                *)this);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_40);
    if (!bVar1) break;
    pprVar3 = __gnu_cxx::
              __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
              ::operator*(&local_30);
    uVar2 = (*(*pprVar3)->_vptr_rt_latex_processor_interface[2])(*pprVar3,e,output);
    it._M_current._7_1_ = (it._M_current._7_1_ & 1) != 0 || (uVar2 & 1) != 0;
    __gnu_cxx::
    __normal_iterator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*const_*,_std::vector<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*,_std::allocator<viennamath::rt_latex_processor_interface<viennamath::rt_expression_interface<double>_>_*>_>_>
    ::operator++(&local_30);
  }
  if ((it._M_current._7_1_ & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Warning: Cannot customize LaTeX translator for "
                            );
    poVar4 = operator<<(poVar4,e);
    poVar4 = std::operator<<(poVar4," (no suitable processor found)");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void customize(ExpressionType const & e, std::string output)
      {
        bool found = false;
        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          found |= (*it)->customize(&e, output);
        }

        if (!found)
          std::cerr << "Warning: Cannot customize LaTeX translator for " << e << " (no suitable processor found)" << std::endl;
        //variable_strings_[x.id()] = output;
      }